

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

int QMetaObject::connect(int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 in_register_0000003c;
  long in_FS_OFFSET;
  QMetaObject *smeta;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  smeta = (QMetaObject *)(*(code *)**(undefined8 **)__addr)(__addr);
  uVar1 = methodIndexToSignalIndex(&smeta,__len);
  iVar2 = QMetaObjectPrivate::connect((int)__addr,(sockaddr *)(ulong)uVar1,(socklen_t)smeta);
  *(ulong *)CONCAT44(in_register_0000003c,__fd) = CONCAT44(extraout_var,iVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __fd;
  }
  __stack_chk_fail();
}

Assistant:

QMetaObject::Connection QMetaObject::connect(const QObject *sender, int signal_index,
                                             const QObject *receiver, int method_index, int type,
                                             int *types)
{
    const QMetaObject *smeta = sender->metaObject();
    signal_index = methodIndexToSignalIndex(&smeta, signal_index);
    return Connection(QMetaObjectPrivate::connect(sender, signal_index, smeta,
                                       receiver, method_index,
                                       nullptr, //FIXME, we could speed this connection up by computing the relative index
                                       type, types));
}